

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_obj.c
# Opt level: O1

void backtracer_printmsg(t_pd *who,t_symbol *s,int argc,t_atom *argv)

{
  bool bVar1;
  char *pcVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  char msgbuf [104];
  char buf [100];
  char local_108 [100];
  undefined4 local_a4;
  char local_98 [104];
  
  pcVar2 = class_getname(*who);
  snprintf(local_108,100,"%s: %s ",pcVar2,s->s_name);
  sVar3 = strlen(local_108);
  iVar6 = (int)sVar3;
  bVar1 = iVar6 < 100;
  if (0 < argc && bVar1) {
    uVar4 = 5;
    if (argc < 5) {
      uVar4 = (ulong)(uint)argc;
    }
    uVar5 = 1;
    do {
      atom_string(argv,local_98,100);
      snprintf(local_108 + (int)sVar3,(ulong)(100 - (int)sVar3)," %s",local_98);
      sVar3 = strlen(local_108);
      iVar6 = (int)sVar3;
      bVar1 = iVar6 < 100;
      if (uVar4 <= uVar5) break;
      argv = argv + 1;
      uVar5 = uVar5 + 1;
    } while (iVar6 < 100);
  }
  if ((bool)(5 < argc & bVar1)) {
    builtin_strncpy(local_108 + iVar6,"...",4);
  }
  else {
    local_a4 = 0x2e2e2e;
  }
  logpost(who,2,"%s",local_108);
  return;
}

Assistant:

static void backtracer_printmsg(t_pd *who, t_symbol *s,
    int argc, t_atom *argv)
{
    char msgbuf[104];
    int nprint = (argc > NARGS ? NARGS : argc), nchar, i;
    snprintf(msgbuf, 100, "%s: %s ", class_getname(*who), s->s_name);
    nchar = strlen(msgbuf);
    for (i = 0; i < nprint && nchar < 100; i++)
        if (nchar < 100)
    {
        char buf[100];
        atom_string(&argv[i], buf, 100);
        snprintf(msgbuf + nchar, 100-nchar, " %s", buf);
        nchar = strlen(msgbuf);
    }
    if (argc > nprint && nchar < 100)
        sprintf(msgbuf + nchar, "...");
    else memcpy(msgbuf+100, "...", 4); /* in case we didn't finish */
    logpost(who, 2, "%s", msgbuf);
}